

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_33386e4::BIP32PubkeyProvider::GetDerivedExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *xprv,CExtKey *last_hardened)

{
  long lVar1;
  bool bVar2;
  reference puVar3;
  CExtKey *in_RDX;
  SigningProvider *in_RSI;
  BIP32PubkeyProvider *in_RDI;
  long in_FS_OFFSET;
  uint entry;
  KeyPath *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = GetExtKey(in_RDI,in_RSI,in_RDX);
  if (bVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(in_stack_ffffffffffffff98);
      uVar4 = *puVar3;
      bVar2 = CExtKey::Derive((CExtKey *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(CExtKey *)in_RDI
                              ,in_stack_ffffffffffffffa4);
      if (!bVar2) {
        local_19 = false;
        goto LAB_019e2f5e;
      }
      if ((int)uVar4 < 0) {
        CExtKey::operator=((CExtKey *)in_RDI,
                           (CExtKey *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
        ;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(in_stack_ffffffffffffff98);
    }
    local_19 = true;
  }
  else {
    local_19 = false;
  }
LAB_019e2f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool GetDerivedExtKey(const SigningProvider& arg, CExtKey& xprv, CExtKey& last_hardened) const
    {
        if (!GetExtKey(arg, xprv)) return false;
        for (auto entry : m_path) {
            if (!xprv.Derive(xprv, entry)) return false;
            if (entry >> 31) {
                last_hardened = xprv;
            }
        }
        return true;
    }